

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O1

vector<Color,_std::allocator<Color>_> * __thiscall
Face::update_layer(vector<Color,_std::allocator<Color>_> *__return_storage_ptr__,Face *this,
                  Corner corner,int layer,vector<Color,_std::allocator<Color>_> *new_layer)

{
  Color CVar1;
  iterator __position;
  iterator iVar2;
  mapped_type *ppCVar3;
  ulong uVar4;
  ulong uVar5;
  Position to_access;
  key_type local_44;
  vector<Color,_std::allocator<Color>_> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (-1 < layer) {
    uVar4 = 0;
    uVar5 = (ulong)(uint)(layer * 2);
    if (layer * 2 < 1) {
      uVar5 = uVar4;
    }
    local_44.reference_corner = corner;
    local_44.layer = layer;
    local_38 = new_layer;
    do {
      local_44.entry = (int)uVar4;
      iVar2 = std::
              _Rb_tree<Position,_std::pair<const_Position,_Color_*>,_std::_Select1st<std::pair<const_Position,_Color_*>_>,_std::less<Position>,_std::allocator<std::pair<const_Position,_Color_*>_>_>
              ::find(&(this->current_state)._M_t,&local_44);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Color,std::allocator<Color>>::_M_realloc_insert<Color_const&>
                  ((vector<Color,std::allocator<Color>> *)__return_storage_ptr__,__position,
                   &(iVar2._M_node[1]._M_left)->_M_color);
      }
      else {
        *__position._M_current = (iVar2._M_node[1]._M_left)->_M_color;
        (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      CVar1 = (local_38->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar4];
      ppCVar3 = std::
                map<Position,_Color_*,_std::less<Position>,_std::allocator<std::pair<const_Position,_Color_*>_>_>
                ::operator[](&this->current_state,&local_44);
      **ppCVar3 = CVar1;
      uVar4 = uVar4 + 1;
    } while (uVar5 + 1 != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Color> Face::update_layer(Corner corner, int layer, std::vector<Color> new_layer){
    std::vector<Color> old_layer;
    Position to_access;
    to_access.layer =  layer;
    to_access.reference_corner = corner;
    for(int entry = 0; entry < 2*layer + 1; entry++){
        to_access.entry = entry;
        old_layer.push_back(*current_state.find(to_access)->second);
        *(current_state[to_access]) = new_layer[entry];
    }
    return old_layer;
}